

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_char[19],_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[106]>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,char_const[19],int,std::__cxx11::string,char_const[106]>
            (uint *args,char (*args_1) [19],int *args_2,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
            char (*args_4) [106])

{
  size_t sVar1;
  undefined4 *in_RCX;
  longlong in_RDX;
  undefined4 *in_RSI;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_char[19],_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[106]>
  *in_RDI;
  longlong in_R9;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_char_4;
  undefined1 local_1a9;
  char *local_1a8;
  size_t local_1a0;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  char *local_188 [4];
  undefined1 *local_168;
  basic_string_view<char> local_160;
  char **local_150;
  basic_string_view<char> local_148 [4];
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  longlong local_f8;
  size_t local_f0;
  undefined4 local_e4;
  undefined1 *local_e0;
  undefined4 local_d4;
  longlong *local_d0;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  longlong local_b8;
  size_t local_b0;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined4 local_94;
  longlong *local_90;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_78 [8];
  size_t local_70;
  undefined1 *local_60;
  undefined1 *local_50;
  size_t local_30;
  
  local_c1 = 1;
  local_c2 = 1;
  local_c3 = 1;
  local_a4 = *in_RSI;
  local_a0 = &local_c4;
  local_90 = &local_b8;
  local_b8._0_4_ = local_a4;
  local_81 = 1;
  local_82 = 1;
  local_83 = 1;
  local_60 = &local_84;
  local_50 = local_78;
  local_101 = 1;
  local_102 = 1;
  local_103 = 1;
  local_e4 = *in_RCX;
  local_e0 = &local_104;
  local_d0 = &local_f8;
  local_f8._0_4_ = local_e4;
  local_191 = 1;
  local_192 = 1;
  local_193 = 1;
  local_168 = &local_1a9;
  local_d4 = local_e4;
  local_94 = local_a4;
  local_160 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2e0f1e);
  local_1a8 = local_160.data_;
  local_1a0 = local_160.size_;
  local_148[0].data_ = local_160.data_;
  local_148[0].size_ = local_160.size_;
  local_150 = local_188;
  local_188[0] = basic_string_view<char>::data(local_148);
  sVar1 = basic_string_view<char>::size(local_148);
  (in_RDI->data_).args_[0].field_0.long_long_value = local_b8;
  (in_RDI->data_).args_[0].field_0.string.size = local_b0;
  (in_RDI->data_).args_[1].field_0.long_long_value = in_RDX;
  (in_RDI->data_).args_[1].field_0.string.size = local_70;
  (in_RDI->data_).args_[2].field_0.long_long_value = local_f8;
  (in_RDI->data_).args_[2].field_0.string.size = local_f0;
  (in_RDI->data_).args_[3].field_0.string.data = local_188[0];
  (in_RDI->data_).args_[3].field_0.string.size = sVar1;
  (in_RDI->data_).args_[4].field_0.long_long_value = in_R9;
  (in_RDI->data_).args_[4].field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}